

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall libtorrent::aux::peer_list::inc_failcount(peer_list *this,torrent_peer *p)

{
  bool bVar1;
  bool was_conn_cand;
  torrent_peer *p_local;
  peer_list *this_local;
  
  if ((*(uint *)&p->field_0x1b & 0x1f) != 0x1f) {
    bVar1 = is_connect_candidate(this,p);
    *(uint *)&p->field_0x1b =
         *(uint *)&p->field_0x1b & 0xffffffe0 | (*(uint *)&p->field_0x1b & 0x1f) + 1 & 0x1f;
    if ((bVar1) && (bVar1 = is_connect_candidate(this,p), !bVar1)) {
      update_connect_candidates(this,-1);
    }
  }
  return;
}

Assistant:

void peer_list::inc_failcount(torrent_peer* p)
	{
		INVARIANT_CHECK;
		// failcount is a 5 bit value
		if (p->failcount == 31) return;

		bool const was_conn_cand = is_connect_candidate(*p);
		++p->failcount;
		if (was_conn_cand && !is_connect_candidate(*p))
			update_connect_candidates(-1);
	}